

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O3

uint64_t basisu::color_cell_compression_est_astc
                   (uint32_t num_weights,uint32_t num_comps,uint32_t *pWeight_table,
                   uint32_t num_pixels,color_quad_u8 *pPixels,uint64_t best_err_so_far,
                   uint32_t *weights)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  undefined1 uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined4 uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  color_quad_u8 weightedColors [32];
  int thresh [31];
  int dots [32];
  undefined4 local_1b8;
  undefined1 local_1b4 [124];
  int aiStack_138 [32];
  int local_b8 [34];
  ulong uVar7;
  
  if (1 < num_comps - 3) {
    __assert_fail("num_comps == 3 || num_comps == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6ef,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  uVar6 = num_weights - 1;
  uVar7 = (ulong)uVar6;
  if (0x1f < uVar6) {
    __assert_fail("num_weights >= 1 && num_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f0,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if ((*pWeight_table != 0) || (pWeight_table[uVar7] != 0x40)) {
    __assert_fail("pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x6f1,
                  "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                 );
  }
  if (num_comps == 4) {
    if (num_pixels == 0) {
      uVar25 = 0;
LAB_0020a5b2:
      uVar12 = 0;
      uVar11 = 0;
      uVar20 = 0;
      uVar24 = 0xff;
      uVar22 = 0xff;
      uVar18 = 0xff;
      uVar23 = 0xff;
    }
    else {
      uVar9 = 0;
      uVar23 = 0xff;
      uVar18 = 0xff;
      uVar22 = 0xff;
      uVar24 = 0xff;
      uVar20 = 0;
      uVar11 = 0;
      uVar12 = 0;
      uVar25 = 0;
      do {
        bVar1 = pPixels[uVar9].m_c[0];
        if (bVar1 <= uVar23) {
          uVar23 = (uint)bVar1;
        }
        bVar2 = pPixels[uVar9].m_c[1];
        if (bVar2 <= uVar18) {
          uVar18 = (uint)bVar2;
        }
        bVar3 = pPixels[uVar9].m_c[2];
        if (bVar3 <= uVar22) {
          uVar22 = (uint)bVar3;
        }
        bVar4 = pPixels[uVar9].m_c[3];
        if (bVar4 <= uVar24) {
          uVar24 = (uint)bVar4;
        }
        if (uVar20 <= bVar1) {
          uVar20 = (uint)bVar1;
        }
        if (uVar11 <= bVar2) {
          uVar11 = (uint)bVar2;
        }
        if (uVar12 <= bVar3) {
          uVar12 = (uint)bVar3;
        }
        if (uVar25 <= bVar4) {
          uVar25 = (uint)bVar4;
        }
        uVar9 = uVar9 + 1;
      } while (num_pixels != uVar9);
    }
  }
  else {
    if (num_pixels == 0) {
      uVar25 = 0xff;
      goto LAB_0020a5b2;
    }
    uVar9 = 0;
    uVar25 = 0xff;
    uVar23 = 0xff;
    uVar18 = 0xff;
    uVar22 = 0xff;
    uVar20 = 0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      bVar1 = pPixels[uVar9].m_c[0];
      if (bVar1 <= uVar23) {
        uVar23 = (uint)bVar1;
      }
      bVar2 = pPixels[uVar9].m_c[1];
      if (bVar2 <= uVar18) {
        uVar18 = (uint)bVar2;
      }
      bVar3 = pPixels[uVar9].m_c[2];
      if (bVar3 <= uVar22) {
        uVar22 = (uint)bVar3;
      }
      uVar24 = (uint)bVar1;
      if (bVar1 < uVar20) {
        uVar24 = uVar20;
      }
      uVar20 = uVar24;
      uVar24 = (uint)bVar2;
      if (bVar2 < uVar11) {
        uVar24 = uVar11;
      }
      uVar11 = uVar24;
      uVar24 = (uint)bVar3;
      if (bVar3 < uVar12) {
        uVar24 = uVar12;
      }
      uVar12 = uVar24;
      uVar9 = uVar9 + 1;
    } while (num_pixels != uVar9);
    uVar24 = 0xff;
  }
  local_1b8 = uVar18 * 0x100 | uVar23 | uVar22 << 0x10 | uVar24 << 0x18;
  *(uint *)(local_1b4 + uVar7 * 4 + -4) = uVar12 << 0x10 | uVar25 << 0x18 | uVar11 * 0x100 | uVar20;
  if (1 < uVar6) {
    lVar16 = 0;
    do {
      uVar5 = pWeight_table[lVar16 + 1];
      iVar8 = 0x40 - uVar5;
      *(char *)(aiStack_138 + lVar16 + -0x1f) =
           (char)(iVar8 * uVar23 * 0x101 + uVar5 * (uVar20 << 8 | uVar20) + 0x20 >> 0xe);
      *(char *)((long)aiStack_138 + lVar16 * 4 + -0x7b) =
           (char)(uVar5 * uVar11 * 0x101 + iVar8 * uVar18 * 0x101 + 0x20 >> 0xe);
      *(char *)((long)aiStack_138 + lVar16 * 4 + -0x7a) =
           (char)(iVar8 * uVar22 * 0x101 + uVar5 * (uVar12 << 8 | uVar12) + 0x20 >> 0xe);
      uVar14 = 0xff;
      if (num_comps == 4) {
        uVar14 = (undefined1)(uVar5 * (uVar25 << 8 | uVar25) + iVar8 * uVar24 * 0x101 + 0x20 >> 0xe)
        ;
      }
      *(undefined1 *)((long)aiStack_138 + lVar16 * 4 + -0x79) = uVar14;
      lVar16 = lVar16 + 1;
    } while (uVar7 - 1 != lVar16);
  }
  iVar21 = uVar20 - uVar23;
  iVar8 = uVar11 - uVar18;
  iVar13 = uVar12 - uVar22;
  iVar19 = uVar25 - uVar24;
  if (num_comps == 4) {
    if (num_weights != 0) {
      uVar9 = 0;
      do {
        local_b8[uVar9] =
             (uint)(byte)local_1b4[uVar9 * 4 + -1] * iVar19 +
             (uint)(byte)local_1b4[uVar9 * 4 + -2] * iVar13 +
             (uint)(byte)local_1b4[uVar9 * 4 + -3] * iVar8 +
             (uint)(byte)local_1b4[uVar9 * 4 + -4] * iVar21;
        uVar9 = uVar9 + 1;
      } while (num_weights != uVar9);
LAB_0020a7eb:
      if (uVar6 == 0) goto LAB_0020a829;
    }
  }
  else {
    if (uVar25 != uVar24) {
      __assert_fail("aa == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                    ,0x736,
                    "uint64_t basisu::color_cell_compression_est_astc(uint32_t, uint32_t, const uint32_t *, uint32_t, const color_quad_u8 *, uint64_t, const uint32_t *)"
                   );
    }
    if (num_weights != 0) {
      uVar9 = 0;
      do {
        local_b8[uVar9] =
             (uint)(byte)local_1b4[uVar9 * 4 + -2] * iVar13 +
             (uint)(byte)local_1b4[uVar9 * 4 + -3] * iVar8 +
             (uint)(byte)local_1b4[uVar9 * 4 + -4] * iVar21;
        uVar9 = uVar9 + 1;
      } while (num_weights != uVar9);
      goto LAB_0020a7eb;
    }
  }
  uVar9 = 0;
  do {
    iVar15 = local_b8[uVar9 + 1];
    aiStack_138[uVar9] = local_b8[0] + iVar15 + 1 >> 1;
    uVar9 = uVar9 + 1;
    local_b8[0] = iVar15;
  } while (uVar7 != uVar9);
LAB_0020a829:
  auVar26 = *(undefined1 (*) [16])weights;
  auVar27._0_8_ = auVar26._8_8_;
  auVar27._8_4_ = auVar26._8_4_;
  auVar27._12_4_ = auVar26._12_4_;
  auVar27 = auVar27 | auVar26;
  uVar29 = auVar27._4_4_;
  auVar31._4_4_ = uVar29;
  auVar31._0_4_ = uVar29;
  auVar31._8_4_ = uVar29;
  auVar31._12_4_ = uVar29;
  auVar30 = auVar31 | auVar27;
  if (auVar30._0_4_ == 1) {
    if (num_comps == 4) {
      uVar6 = 0;
      if (num_pixels != 0) {
        uVar9 = 0;
        do {
          auVar26 = pmovzxbd(auVar26,*(undefined4 *)pPixels[uVar6].m_c);
          if (1 < (int)num_weights) {
            uVar10 = uVar7;
            do {
              if (aiStack_138[(int)uVar10 - 1] <=
                  auVar26._12_4_ * iVar19 + auVar26._8_4_ * iVar13 +
                  auVar26._4_4_ * iVar8 + auVar26._0_4_ * iVar21) goto LAB_0020a8c2;
              uVar10 = uVar10 - 1;
            } while (0 < (int)uVar10);
          }
          uVar10 = 0;
LAB_0020a8c2:
          auVar27 = pmovzxbd(auVar27,*(undefined4 *)(local_1b4 + uVar10 * 4 + -4));
          auVar28._0_4_ = auVar27._0_4_ - auVar26._0_4_;
          auVar28._4_4_ = auVar27._4_4_ - auVar26._4_4_;
          auVar28._8_4_ = auVar27._8_4_ - auVar26._8_4_;
          auVar28._12_4_ = auVar27._12_4_ - auVar26._12_4_;
          auVar27 = pmulld(auVar28,auVar28);
          auVar27 = phaddd(auVar27,auVar27);
          auVar27 = phaddd(auVar27,auVar27);
          uVar9 = uVar9 + auVar27._0_4_;
          if (best_err_so_far < uVar9) {
            return uVar9;
          }
          uVar6 = uVar6 + 1;
          if (uVar6 == num_pixels) {
            return uVar9;
          }
        } while( true );
      }
    }
    else {
      uVar6 = 0;
      if (num_pixels != 0) {
        uVar9 = 0;
        do {
          if (1 < (int)num_weights) {
            uVar10 = uVar7;
            do {
              if (aiStack_138[(int)uVar10 - 1] <=
                  (int)(iVar13 * (uint)pPixels[uVar6].m_c[2] +
                       iVar8 * (uint)pPixels[uVar6].m_c[1] + iVar21 * (uint)pPixels[uVar6].m_c[0]))
              goto LAB_0020aa0c;
              uVar10 = uVar10 - 1;
            } while (0 < (int)uVar10);
          }
          uVar10 = 0;
LAB_0020aa0c:
          iVar17 = (uint)(byte)local_1b4[uVar10 * 4 + -4] - (uint)pPixels[uVar6].m_c[0];
          iVar15 = (uint)(byte)local_1b4[uVar10 * 4 + -3] - (uint)pPixels[uVar6].m_c[1];
          iVar19 = (uint)(byte)local_1b4[uVar10 * 4 + -2] - (uint)pPixels[uVar6].m_c[2];
          uVar9 = uVar9 + (uint)(iVar19 * iVar19 + iVar15 * iVar15 + iVar17 * iVar17);
          if (best_err_so_far < uVar9) {
            return uVar9;
          }
          uVar6 = uVar6 + 1;
          if (uVar6 == num_pixels) {
            return uVar9;
          }
        } while( true );
      }
    }
  }
  else if (num_comps == 4) {
    uVar6 = 0;
    if (num_pixels != 0) {
      uVar9 = 0;
      do {
        auVar27 = pmovzxbd(auVar27,*(undefined4 *)pPixels[uVar6].m_c);
        if (1 < (int)num_weights) {
          uVar10 = uVar7;
          do {
            if (aiStack_138[(int)uVar10 - 1] <=
                auVar27._12_4_ * iVar19 + auVar27._8_4_ * iVar13 +
                auVar27._4_4_ * iVar8 + auVar27._0_4_ * iVar21) goto LAB_0020a96a;
            uVar10 = uVar10 - 1;
          } while (0 < (int)uVar10);
        }
        uVar10 = 0;
LAB_0020a96a:
        auVar31 = pmovzxbd(auVar30,*(undefined4 *)(local_1b4 + uVar10 * 4 + -4));
        auVar30._0_4_ = auVar31._0_4_ - auVar27._0_4_;
        auVar30._4_4_ = auVar31._4_4_ - auVar27._4_4_;
        auVar30._8_4_ = auVar31._8_4_ - auVar27._8_4_;
        auVar30._12_4_ = auVar31._12_4_ - auVar27._12_4_;
        auVar27 = pmulld(auVar30,auVar26);
        auVar27 = pmulld(auVar27,auVar30);
        auVar27 = phaddd(auVar27,auVar27);
        auVar27 = phaddd(auVar27,auVar27);
        uVar9 = uVar9 + auVar27._0_4_;
        if (best_err_so_far < uVar9) {
          return uVar9;
        }
        uVar6 = uVar6 + 1;
        if (uVar6 == num_pixels) {
          return uVar9;
        }
      } while( true );
    }
  }
  else {
    uVar6 = 0;
    if (num_pixels != 0) {
      uVar9 = 0;
      do {
        if ((int)num_weights < 2) {
          uVar10 = 0;
        }
        else {
          uVar10 = uVar7;
          do {
            if (aiStack_138[(int)uVar10 - 1] <=
                (int)(iVar13 * (uint)pPixels[uVar6].m_c[2] +
                     iVar8 * (uint)pPixels[uVar6].m_c[1] + iVar21 * (uint)pPixels[uVar6].m_c[0]))
            goto LAB_0020aada;
            uVar10 = uVar10 - 1;
          } while (0 < (int)uVar10);
          uVar10 = 0;
        }
LAB_0020aada:
        iVar17 = (uint)(byte)local_1b4[uVar10 * 4 + -4] - (uint)pPixels[uVar6].m_c[0];
        iVar15 = (uint)(byte)local_1b4[uVar10 * 4 + -3] - (uint)pPixels[uVar6].m_c[1];
        iVar19 = (uint)(byte)local_1b4[uVar10 * 4 + -2] - (uint)pPixels[uVar6].m_c[2];
        uVar9 = uVar9 + (uint)(iVar19 * auVar26._8_4_ * iVar19 +
                              iVar15 * auVar26._4_4_ * iVar15 + iVar17 * auVar26._0_4_ * iVar17);
        if (best_err_so_far < uVar9) {
          return uVar9;
        }
        uVar6 = uVar6 + 1;
        if (uVar6 == num_pixels) {
          return uVar9;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

uint64_t color_cell_compression_est_astc(
	uint32_t num_weights, uint32_t num_comps, const uint32_t *pWeight_table,
	uint32_t num_pixels, const color_quad_u8* pPixels, 
	uint64_t best_err_so_far, const uint32_t weights[4])
{
	assert(num_comps == 3 || num_comps == 4);
	assert(num_weights >= 1 && num_weights <= 32);
	assert(pWeight_table[0] == 0 && pWeight_table[num_weights - 1] == 64);

	// Find RGB bounds as an approximation of the block's principle axis
	uint32_t lr = 255, lg = 255, lb = 255, la = 255;
	uint32_t hr = 0, hg = 0, hb = 0, ha = 0;
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];
			if (pC->m_c[3] < la) la = pC->m_c[3];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
			if (pC->m_c[3] > ha) ha = pC->m_c[3];
		}
	}
	else
	{
		for (uint32_t i = 0; i < num_pixels; i++)
		{
			const color_quad_u8* pC = &pPixels[i];
			if (pC->m_c[0] < lr) lr = pC->m_c[0];
			if (pC->m_c[1] < lg) lg = pC->m_c[1];
			if (pC->m_c[2] < lb) lb = pC->m_c[2];

			if (pC->m_c[0] > hr) hr = pC->m_c[0];
			if (pC->m_c[1] > hg) hg = pC->m_c[1];
			if (pC->m_c[2] > hb) hb = pC->m_c[2];
		}
		la = 255;
		ha = 255;
	}

	color_quad_u8 lowColor, highColor;
	color_quad_u8_set(&lowColor, lr, lg, lb, la);
	color_quad_u8_set(&highColor, hr, hg, hb, ha);

	// Place endpoints at bbox diagonals and compute interpolated colors 
	color_quad_u8 weightedColors[32];

	weightedColors[0] = lowColor;
	weightedColors[num_weights - 1] = highColor;
	for (uint32_t i = 1; i < (num_weights - 1); i++)
	{
		weightedColors[i].m_c[0] = (uint8_t)astc_interpolate_linear(lowColor.m_c[0], highColor.m_c[0], pWeight_table[i]);
		weightedColors[i].m_c[1] = (uint8_t)astc_interpolate_linear(lowColor.m_c[1], highColor.m_c[1], pWeight_table[i]);
		weightedColors[i].m_c[2] = (uint8_t)astc_interpolate_linear(lowColor.m_c[2], highColor.m_c[2], pWeight_table[i]);
		weightedColors[i].m_c[3] = (num_comps == 4) ? (uint8_t)astc_interpolate_linear(lowColor.m_c[3], highColor.m_c[3], pWeight_table[i]) : 255;
	}

	// Compute dots and thresholds
	const int ar = highColor.m_c[0] - lowColor.m_c[0];
	const int ag = highColor.m_c[1] - lowColor.m_c[1];
	const int ab = highColor.m_c[2] - lowColor.m_c[2];
	const int aa = highColor.m_c[3] - lowColor.m_c[3];

	int dots[32];
	if (num_comps == 4)
	{
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab + weightedColors[i].m_c[3] * aa;
	}
	else
	{
		assert(aa == 0);
		for (uint32_t i = 0; i < num_weights; i++)
			dots[i] = weightedColors[i].m_c[0] * ar + weightedColors[i].m_c[1] * ag + weightedColors[i].m_c[2] * ab;
	}

	int thresh[32 - 1];
	for (uint32_t i = 0; i < (num_weights - 1); i++)
		thresh[i] = (dots[i] + dots[i + 1] + 1) >> 1;

	uint64_t total_err = 0;
	if ((weights[0] | weights[1] | weights[2] | weights[3]) == 1)
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += (dr * dr) + (dg * dg) + (db * db) + (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += (dr * dr) + (dg * dg) + (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}
	else
	{
		if (num_comps == 4)
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2] + aa * pC->m_c[3];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];
				int da = (int)pE1->m_c[3] - (int)pC->m_c[3];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db) + weights[3] * (da * da);
				if (total_err > best_err_so_far)
					break;
			}
		}
		else
		{
			for (uint32_t i = 0; i < num_pixels; i++)
			{
				const color_quad_u8* pC = &pPixels[i];

				int d = ar * pC->m_c[0] + ag * pC->m_c[1] + ab * pC->m_c[2];

				// Find approximate selector
				uint32_t s = 0;
				for (int j = num_weights - 2; j >= 0; j--)
				{
					if (d >= thresh[j])
					{
						s = j + 1;
						break;
					}
				}

				// Compute error
				const color_quad_u8* pE1 = &weightedColors[s];

				int dr = (int)pE1->m_c[0] - (int)pC->m_c[0];
				int dg = (int)pE1->m_c[1] - (int)pC->m_c[1];
				int db = (int)pE1->m_c[2] - (int)pC->m_c[2];

				total_err += weights[0] * (dr * dr) + weights[1] * (dg * dg) + weights[2] * (db * db);
				if (total_err > best_err_so_far)
					break;
			}
		}
	}

	return total_err;
}